

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O1

void __thiscall
Units_checkingOwningModelOneUnit_Test::TestBody(Units_checkingOwningModelOneUnit_Test *this)

{
  string *psVar1;
  char cVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  UnitsPtr u2;
  UnitsPtr u1;
  ModelPtr model;
  UnitsPtr u;
  long *local_c8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  long local_b8 [2];
  long *local_a8 [2];
  long local_98 [2];
  long *local_88 [2];
  long local_78 [2];
  string *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  string *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  shared_ptr *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  string *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  libcellml::Model::create();
  libcellml::Units::create();
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"u","");
  libcellml::NamedEntity::setName(local_38);
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_58;
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"u1","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"u","");
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"milli","");
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"");
  libcellml::Units::addUnit(local_58,(string *)&local_c8,1.0,1.0,(string *)local_a8);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  libcellml::Units::create();
  psVar1 = local_68;
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"u2","");
  libcellml::NamedEntity::setName(psVar1);
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"apples","");
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"kilo","");
  pcVar3 = "";
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"","");
  libcellml::Units::addUnit(local_68,(string *)&local_c8,2.0,1000.0,(string *)local_a8);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0],local_98[0] + 1);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8,local_b8[0] + 1);
  }
  libcellml::Model::addUnits(local_48);
  libcellml::Model::addUnits(local_48);
  libcellml::Model::addUnits(local_48);
  local_a8[0] = (long *)0x0;
  local_88[0] = (long *)libcellml::Units::scalingFactor
                                  ((shared_ptr *)&local_58,(shared_ptr *)&local_68,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_c8,"0.0","libcellml::Units::scalingFactor(u1, u2)",
             (double *)local_a8,(double *)local_88);
  if (local_c8._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_c0.ptr_ != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x567,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if (local_a8[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a8[0] != (long *)0x0)) {
        (**(code **)(*local_a8[0] + 8))();
      }
      local_a8[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_a8[0] = (long *)0x0;
  local_88[0] = (long *)libcellml::Units::scalingFactor
                                  ((shared_ptr *)&local_68,(shared_ptr *)&local_58,true);
  testing::internal::CmpHelperEQ<double,double>
            ((internal *)&local_c8,"0.0","libcellml::Units::scalingFactor(u2, u1)",
             (double *)local_a8,(double *)local_88);
  if (local_c8._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)local_a8);
    if (local_c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x568,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_88,(Message *)local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_88);
    if (local_a8[0] != (long *)0x0) {
      cVar2 = testing::internal::IsTrue(true);
      if ((cVar2 != '\0') && (local_a8[0] != (long *)0x0)) {
        (**(code **)(*local_a8[0] + 8))();
      }
      local_a8[0] = (long *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_60);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  return;
}

Assistant:

TEST(Units, checkingOwningModelOneUnit)
{
    libcellml::ModelPtr model = libcellml::Model::create();

    libcellml::UnitsPtr u = libcellml::Units::create();
    u->setName("u");

    libcellml::UnitsPtr u1 = libcellml::Units::create();
    u1->setName("u1");
    u1->addUnit("u", "milli", 1.0, 1.0); // u1 is a parent of u

    libcellml::UnitsPtr u2 = libcellml::Units::create();
    u2->setName("u2");
    u2->addUnit("apples", "kilo", 2.0, 1000.0); // apples not in model

    model->addUnits(u);
    model->addUnits(u1);
    model->addUnits(u2);

    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u1, u2));
    EXPECT_EQ(0.0, libcellml::Units::scalingFactor(u2, u1));
}